

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O0

int getstring(int *ip,char *buffer,int size)

{
  int iVar1;
  ushort **ppuVar2;
  int local_2c;
  int i;
  char c;
  int size_local;
  char *buffer_local;
  int *ip_local;
  
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)prlnbuf[*ip]] & 0x2000) != 0) {
    *ip = *ip + 1;
  }
  iVar1 = *ip;
  *ip = iVar1 + 1;
  if (prlnbuf[iVar1] == '\"') {
    local_2c = 0;
    while( true ) {
      iVar1 = *ip;
      *ip = iVar1 + 1;
      if (prlnbuf[iVar1] == '\"') break;
      if (size <= local_2c) {
        error("String too long!");
        return 0;
      }
      buffer[local_2c] = prlnbuf[iVar1];
      local_2c = local_2c + 1;
    }
    buffer[local_2c] = '\0';
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)prlnbuf[*ip]] & 0x2000) != 0) {
      *ip = *ip + 1;
    }
    ip_local._4_4_ = 1;
  }
  else {
    error("Incorrect string syntax!");
    ip_local._4_4_ = 0;
  }
  return ip_local._4_4_;
}

Assistant:

int
getstring(int *ip, char *buffer, int size)
{
	char c;
	int i;

	/* skip spaces */
	while (isspace(prlnbuf[*ip]))
		(*ip)++;

	/* string must be enclosed */
	if (prlnbuf[(*ip)++] != '\"') {
		error("Incorrect string syntax!");
		return (0);
	}

	/* get string */
	i = 0;
	for (;;) {
		c = prlnbuf[(*ip)++];
		if (c == '\"')
			break;
		if (i >= size) {
			error("String too long!");
			return (0);
		}
		buffer[i++] = c;
	}

	/* end the string */
	buffer[i] = '\0';

	/* skip spaces */
	while (isspace(prlnbuf[*ip]))
		(*ip)++;

	/* ok */
	return (1);
}